

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O0

void __thiscall SQCompiler::EmitDerefOp(SQCompiler *this,SQOpcode op)

{
  SQFuncState *this_00;
  SQInteger arg3;
  SQInteger arg2;
  SQInteger arg1;
  SQInteger arg0;
  SQInteger src;
  SQInteger key;
  SQInteger val;
  SQOpcode op_local;
  SQCompiler *this_local;
  
  arg3 = SQFuncState::PopTarget(this->_fs);
  arg2 = SQFuncState::PopTarget(this->_fs);
  arg1 = SQFuncState::PopTarget(this->_fs);
  this_00 = this->_fs;
  arg0 = SQFuncState::PushTarget(this->_fs,-1);
  SQFuncState::AddInstruction(this_00,op,arg0,arg1,arg2,arg3);
  return;
}

Assistant:

void EmitDerefOp(SQOpcode op)
    {
        SQInteger val = _fs->PopTarget();
        SQInteger key = _fs->PopTarget();
        SQInteger src = _fs->PopTarget();
        _fs->AddInstruction(op,_fs->PushTarget(),src,key,val);
    }